

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_manager.cpp
# Opt level: O0

void __thiscall cfd::core::CfdCoreManager::~CfdCoreManager(CfdCoreManager *this)

{
  bool bVar1;
  reference ppiVar2;
  CfdCoreHandle handle;
  iterator __end3;
  iterator __begin3;
  vector<int_*,_std::allocator<int_*>_> *__range3;
  CfdCoreManager *this_local;
  
  this->_vptr_CfdCoreManager = (_func_int **)&PTR__CfdCoreManager_009fa778;
  bVar1 = ::std::vector<int_*,_std::allocator<int_*>_>::empty(&this->handle_list_);
  if (!bVar1) {
    __end3 = ::std::vector<int_*,_std::allocator<int_*>_>::begin(&this->handle_list_);
    handle = (CfdCoreHandle)::std::vector<int_*,_std::allocator<int_*>_>::end(&this->handle_list_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                                       *)&handle), bVar1) {
      ppiVar2 = __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
                operator*(&__end3);
      Finalize(this,*ppiVar2,true);
      __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::operator++
                (&__end3);
    }
  }
  ::std::vector<int_*,_std::allocator<int_*>_>::~vector(&this->handle_list_);
  return;
}

Assistant:

CfdCoreManager::~CfdCoreManager() {
  if (!handle_list_.empty()) {
    for (CfdCoreHandle handle : handle_list_) {
      Finalize(handle, true);
    }
  }
}